

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

connectdata * Curl_conncache_extract_oldest(Curl_easy *data)

{
  size_t *psVar1;
  conncache *hash;
  connectbundle *pcVar2;
  connectdata *pcVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  curl_hash_element *pcVar6;
  timediff_t tVar7;
  long lVar8;
  curl_llist_element *pcVar9;
  curltime cVar10;
  curltime newer;
  curltime older;
  curl_hash_iterator iter;
  connectbundle *local_68;
  connectdata *local_60;
  curl_hash_iterator local_48;
  
  hash = (data->state).conn_cache;
  cVar10 = Curl_now();
  if (data->share != (Curl_share *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  Curl_hash_start_iterate(&hash->hash,&local_48);
  pcVar6 = Curl_hash_next_element(&local_48);
  if (pcVar6 == (curl_hash_element *)0x0) {
    local_68 = (connectbundle *)0x0;
    local_60 = (connectdata *)0x0;
  }
  else {
    lVar8 = -1;
    local_60 = (connectdata *)0x0;
    local_68 = (connectbundle *)0x0;
    do {
      pcVar2 = (connectbundle *)pcVar6->ptr;
      for (pcVar9 = (pcVar2->conn_list).head; pcVar9 != (curl_llist_element *)0x0;
          pcVar9 = pcVar9->next) {
        pcVar3 = (connectdata *)pcVar9->ptr;
        if ((pcVar3->inuse == false) &&
           (uVar4 = (pcVar3->now).tv_sec, uVar5 = (pcVar3->now).tv_usec, older.tv_usec = uVar5,
           older.tv_sec = uVar4, newer._12_4_ = 0, newer.tv_sec = SUB128(cVar10._0_12_,0),
           newer.tv_usec = SUB124(cVar10._0_12_,8), older._12_4_ = 0,
           tVar7 = Curl_timediff(newer,older), lVar8 < tVar7)) {
          lVar8 = tVar7;
          local_68 = pcVar2;
          local_60 = pcVar3;
        }
      }
      pcVar6 = Curl_hash_next_element(&local_48);
    } while (pcVar6 != (curl_hash_element *)0x0);
  }
  if (local_60 != (connectdata *)0x0) {
    bundle_remove_conn(local_68,local_60);
    psVar1 = &hash->num_conn;
    *psVar1 = *psVar1 - 1;
  }
  if (data->share != (Curl_share *)0x0) {
    Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
  }
  return local_60;
}

Assistant:

struct connectdata *
Curl_conncache_extract_oldest(struct Curl_easy *data)
{
  struct conncache *connc = data->state.conn_cache;
  struct curl_hash_iterator iter;
  struct curl_llist_element *curr;
  struct curl_hash_element *he;
  timediff_t highscore =- 1;
  timediff_t score;
  struct curltime now;
  struct connectdata *conn_candidate = NULL;
  struct connectbundle *bundle;
  struct connectbundle *bundle_candidate = NULL;

  now = Curl_now();

  CONN_LOCK(data);
  Curl_hash_start_iterate(&connc->hash, &iter);

  he = Curl_hash_next_element(&iter);
  while(he) {
    struct connectdata *conn;

    bundle = he->ptr;

    curr = bundle->conn_list.head;
    while(curr) {
      conn = curr->ptr;

      if(!conn->inuse) {
        /* Set higher score for the age passed since the connection was used */
        score = Curl_timediff(now, conn->now);

        if(score > highscore) {
          highscore = score;
          conn_candidate = conn;
          bundle_candidate = bundle;
        }
      }
      curr = curr->next;
    }

    he = Curl_hash_next_element(&iter);
  }
  if(conn_candidate) {
    /* remove it to prevent another thread from nicking it */
    bundle_remove_conn(bundle_candidate, conn_candidate);
    connc->num_conn--;
    DEBUGF(infof(data, "The cache now contains %"
                 CURL_FORMAT_CURL_OFF_TU " members\n",
                 (curl_off_t) connc->num_conn));
  }
  CONN_UNLOCK(data);

  return conn_candidate;
}